

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

int __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
copy(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *begin;
  sbyte sVar1;
  int extraout_EAX;
  word_type wVar2;
  reference puVar3;
  ulong uVar4;
  EVP_PKEY_CTX *pEVar5;
  byte bVar6;
  EVP_PKEY_CTX *in_RCX;
  EVP_PKEY_CTX *end;
  ulong __n;
  ulong uVar7;
  EVP_PKEY_CTX *in_R8;
  long in_R9;
  ulong uVar8;
  EVP_PKEY_CTX *pEVar9;
  ulong uVar10;
  iterator *this_00;
  ulong uVar11;
  
  uVar8 = in_R9 - (long)in_R8;
  end = src + uVar8;
  if ((ulong)((long)in_RCX - (long)src) <= uVar8) {
    end = in_RCX;
    uVar8 = (long)in_RCX - (long)src;
  }
  pEVar9 = in_R8 + uVar8;
  if (in_R8 <= src || (EVP_PKEY_CTX *)this != dst) {
    __n = (ulong)pEVar9 >> 6;
    uVar7 = (ulong)in_R8 >> 6;
    uVar10 = (ulong)((uint)in_R8 & 0x3f);
    uVar8 = (ulong)pEVar9 | 0xffffffffffffffc0;
    if (uVar7 != __n) {
      uVar8 = 0;
    }
    wVar2 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                 *)dst,(size_t)src,(size_t)(src + uVar8 + (0x40 - uVar10)));
    this_00 = &(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start;
    puVar3 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (this_00,uVar7);
    bVar6 = 0x40 - (-(char)in_R8 & 0x3fU);
    sVar1 = (bVar6 < 0x41) * ('@' - bVar6);
    uVar11 = (*puVar3 << sVar1) >> sVar1;
    puVar3 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (this_00,uVar7);
    uVar4 = (*puVar3 >> (uVar8 & 0x3f)) << (uVar8 & 0x3f);
    if (uVar7 != __n) {
      uVar4 = 0;
    }
    if (uVar10 == 0) {
      uVar11 = 0;
    }
    wVar2 = uVar11 | wVar2 << uVar10 | uVar4;
    pEVar9 = src + (uVar8 - uVar10);
    while( true ) {
      begin = pEVar9 + 0x40;
      puVar3 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                         (this_00,uVar7);
      uVar7 = uVar7 + 1;
      *puVar3 = wVar2;
      if (__n <= uVar7) break;
      wVar2 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)dst,(size_t)begin,(size_t)(pEVar9 + 0x80));
      pEVar9 = begin;
    }
    pEVar5 = end + -0x40;
    if (pEVar5 != pEVar9) {
      wVar2 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)dst,(size_t)begin,(size_t)end);
      puVar3 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                         (this_00,__n);
      uVar7 = (ulong)(byte)(((char)end - (char)pEVar9) - 0x40);
      uVar8 = 0;
      if (end + -0x80 != pEVar9) {
        uVar8 = (*puVar3 >> (uVar7 & 0x3f)) << (uVar7 & 0x3f);
      }
      pEVar5 = (EVP_PKEY_CTX *)
               std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                         (this_00,__n);
      *(ulong *)pEVar5 = uVar8 | wVar2;
    }
    return (int)pEVar5;
  }
  copy_backward<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
            (this,(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)dst,(size_t)src,(size_t)end,(size_t)in_R8,(size_t)pEVar9);
  return extraout_EAX;
}

Assistant:

void bitview<Container>::copy(bitview const&src,
                                      size_t src_begin, size_t src_end,
                                      size_t dest_begin, size_t dest_end)
        {
            size_t srclen = src_end - src_begin;
            size_t destlen = dest_end - dest_begin;
            
            if(destlen < srclen) {
                src_end = src_begin + destlen;
                srclen  = destlen;
            }
            
            if(this == &src && src_begin < dest_begin)
                copy_backward(src, src_begin, src_end, 
                              dest_begin, dest_begin + srclen);
            else
                copy_forward(src, src_begin, src_end, 
                             dest_begin, dest_begin + srclen);
        }